

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Catch *c)

{
  uint index;
  bool bVar1;
  char cVar2;
  Tag *pTVar3;
  FuncSignature *this_00;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  TypeVector *types;
  Newline local_e7;
  CloseBrace local_e6 [2];
  Type local_e4;
  Type local_dc;
  StackVar local_d4;
  uint local_c8;
  Newline local_c2;
  Newline local_c1;
  uint i;
  Type local_98;
  reference local_90;
  Type *type;
  const_iterator __end4;
  const_iterator __begin4;
  TypeVector *__range4;
  Type local_68;
  Type local_60;
  StackVar local_58;
  Type local_4c;
  Index local_44;
  FuncDeclaration *pFStack_40;
  Index num_params;
  FuncDeclaration *tag_type;
  Tag *tag;
  ExternalPtr local_28;
  Catch *local_18;
  Catch *c_local;
  CWriter *this_local;
  
  local_18 = c;
  c_local = (Catch *)this;
  bVar1 = Catch::IsCatchAll(c);
  if (bVar1) {
    Write(this,&local_18->exprs);
  }
  else {
    pTVar3 = Module::GetTag(this->module_,&local_18->var);
    ExternalPtr::GlobalName(&local_28,Tag,&pTVar3->name);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[32],wabt::(anonymous_namespace)::ExternalPtr,char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [32])"if (wasm_rt_exception_tag() == ",&local_28,
               (char (*) [3])0x364594,(OpenBrace *)((long)&tag + 7));
    tag_type = (FuncDeclaration *)Module::GetTag(this->module_,&local_18->var);
    pFStack_40 = &((Tag *)tag_type)->decl;
    local_44 = FuncDeclaration::GetNumParams(pFStack_40);
    if (local_44 == 1) {
      local_4c = FuncDeclaration::GetParamType(pFStack_40,0);
      PushType(this,local_4c);
      Type::Type(&local_60,Any);
      StackVar::StackVar(&local_58,0,local_60);
      local_68 = FuncDeclaration::GetParamType(pFStack_40,0);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[17],wabt::(anonymous_namespace)::StackVar,char_const(&)[31],wabt::Type,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [17])"wasm_rt_memcpy(&",&local_58,
                 (char (*) [31])", wasm_rt_exception(), sizeof(",&local_68,(char (*) [4])0x36483c,
                 (Newline *)((long)&__range4 + 7));
    }
    else if (1 < local_44) {
      this_00 = &pFStack_40->sig;
      __end4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&this_00->param_types);
      type = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                               (&this_00->param_types);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                                         *)&type), bVar1) {
        local_90 = __gnu_cxx::
                   __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                   ::operator*(&__end4);
        local_98 = *local_90;
        PushType(this,local_98);
        __gnu_cxx::
        __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
        ::operator++(&__end4);
      }
      Write(this);
      (anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_
                ((string *)&i,(CWriter *)&pFStack_40->sig,types);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[8],std::__cxx11::string,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [8])0x36198b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (char (*) [6])0x362371,&local_c1);
      std::__cxx11::string::~string((string *)&i);
      (anonymous_namespace)::CWriter::Write<char_const(&)[56],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,
                 (char (*) [56])"wasm_rt_memcpy(&tmp, wasm_rt_exception(), sizeof(tmp));",&local_c2)
      ;
      for (local_c8 = 0; uVar4 = (ulong)local_c8,
          sVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                            (&(pFStack_40->sig).param_types), index = local_c8, uVar4 < sVar5;
          local_c8 = local_c8 + 1) {
        Type::Type(&local_dc,Any);
        StackVar::StackVar(&local_d4,index,local_dc);
        Write(this,&local_d4);
        pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::at
                           (&(pFStack_40->sig).param_types,(ulong)local_c8);
        local_e4.enum_ = pvVar6->enum_;
        local_e4.type_index_ = pvVar6->type_index_;
        cVar2 = MangleType(local_e4);
        Writef(this," = tmp.%c%d;",(ulong)(uint)(int)cVar2,(ulong)local_c8);
        Write(this);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,local_e6,&local_e7);
    }
    Write(this,&local_18->exprs);
    Write(this);
  }
  return;
}

Assistant:

void CWriter::Write(const Catch& c) {
  if (c.IsCatchAll()) {
    Write(c.exprs);
    return;
  }

  Write("if (wasm_rt_exception_tag() == ",
        ExternalPtr(ModuleFieldType::Tag, module_->GetTag(c.var)->name), ") ",
        OpenBrace());

  const Tag* tag = module_->GetTag(c.var);
  const FuncDeclaration& tag_type = tag->decl;
  const Index num_params = tag_type.GetNumParams();
  if (num_params == 1) {
    PushType(tag_type.GetParamType(0));
    Write("wasm_rt_memcpy(&", StackVar(0), ", wasm_rt_exception(), sizeof(",
          tag_type.GetParamType(0), "));", Newline());
  } else if (num_params > 1) {
    for (const auto& type : tag_type.sig.param_types) {
      PushType(type);
    }
    Write(OpenBrace());
    Write("struct ", MangleTagTypes(tag_type.sig.param_types), " tmp;",
          Newline());
    Write("wasm_rt_memcpy(&tmp, wasm_rt_exception(), sizeof(tmp));", Newline());
    for (unsigned int i = 0; i < tag_type.sig.param_types.size(); ++i) {
      Write(StackVar(i));
      Writef(" = tmp.%c%d;", MangleType(tag_type.sig.param_types.at(i)), i);
      Write(Newline());
    }

    Write(CloseBrace(), Newline());
  }

  Write(c.exprs);
  Write(CloseBrace());
}